

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int iVar1;
  Extra_UnateInfo_t *pEVar2;
  void *__s;
  DdNode *n;
  DdNode *n_00;
  int local_54;
  int nSuppSize;
  int i;
  int *pMapVars2Nums;
  DdNode *zTemp;
  DdNode *zCube;
  DdNode *zSet;
  DdNode *bTemp;
  Extra_UnateInfo_t *p;
  DdNode *bSupp_local;
  DdNode *zPairs_local;
  DdManager *dd_local;
  
  iVar1 = Extra_bddSuppSize(dd,bSupp);
  pEVar2 = Extra_UnateInfoAllocate(iVar1);
  __s = malloc((long)dd->size << 2);
  memset(__s,0,(long)dd->size << 2);
  pEVar2->nVarsMax = dd->size;
  local_54 = 0;
  for (zSet = bSupp; zSet != dd->one; zSet = (zSet->type).kids.T) {
    pEVar2->pVars[local_54] =
         (Extra_UnateVar_t)((uint)pEVar2->pVars[local_54] & 0xc0000000 | zSet->index & 0x3fffffff);
    *(int *)((long)__s + (ulong)zSet->index * 4) = local_54;
    local_54 = local_54 + 1;
  }
  Cudd_Ref(zPairs);
  zCube = zPairs;
  while( true ) {
    if (zCube == dd->zero) {
      Cudd_RecursiveDerefZdd(dd,zCube);
      if (__s != (void *)0x0) {
        free(__s);
      }
      return pEVar2;
    }
    n = Extra_zddSelectOneSubset(dd,zCube);
    Cudd_Ref(n);
    if (((n->type).kids.T != dd->one) || ((n->type).kids.E != dd->zero)) break;
    if ((n->index & 1) == 0) {
      iVar1 = *(int *)((long)__s + (ulong)(n->index >> 1) * 4);
      pEVar2->pVars[iVar1] =
           (Extra_UnateVar_t)((uint)pEVar2->pVars[iVar1] & 0xbfffffff | 0x40000000);
    }
    else {
      iVar1 = *(int *)((long)__s + (ulong)(n->index >> 1) * 4);
      pEVar2->pVars[iVar1] =
           (Extra_UnateVar_t)((uint)pEVar2->pVars[iVar1] & 0x7fffffff | 0x80000000);
    }
    pEVar2->nUnate = pEVar2->nUnate + 1;
    n_00 = Cudd_zddDiff(dd,zCube,n);
    Cudd_Ref(n_00);
    Cudd_RecursiveDerefZdd(dd,zCube);
    Cudd_RecursiveDerefZdd(dd,n);
    zCube = n_00;
  }
  __assert_fail("cuddT(zCube) == z1 && cuddE(zCube) == z0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddUnate.c"
                ,0x104,
                "Extra_UnateInfo_t *Extra_UnateInfoCreateFromZdd(DdManager *, DdNode *, DdNode *)");
}

Assistant:

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    Extra_UnateInfo_t * p;
    DdNode * bTemp, * zSet, * zCube, * zTemp;
    int * pMapVars2Nums;
    int i, nSuppSize;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i].iVar = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
//    Cudd_zddPrintCover( dd, zPairs );    printf( "\n" );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add this var to the data structure
        assert( cuddT(zCube) == z1 && cuddE(zCube) == z0 );
        if ( zCube->index & 1 ) // neg
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Neg = 1;
        else
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Pos = 1;
        // count the unate vars
        p->nUnate++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );
    ABC_FREE( pMapVars2Nums );
    return p;

}